

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall Rnase::Rnase(Rnase *this,int footprint,double speed)

{
  allocator local_41;
  string local_40;
  double local_20;
  double speed_local;
  Rnase *pRStack_10;
  int footprint_local;
  Rnase *this_local;
  
  local_20 = speed;
  speed_local._4_4_ = footprint;
  pRStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"__rnase",&local_41);
  MobileElement::MobileElement(&this->super_MobileElement,&local_40,speed_local._4_4_,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_MobileElement)._vptr_MobileElement = (_func_int **)&PTR__Rnase_002aa3c0;
  return;
}

Assistant:

Rnase::Rnase(int footprint, double speed)
    : MobileElement("__rnase", footprint, speed) {}